

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darScript.c
# Opt level: O2

Aig_Man_t * Dar_ManChoiceNew(Aig_Man_t *pAig,Dch_Pars_t *pPars)

{
  void *pvVar1;
  char *pcVar2;
  char *pcVar3;
  abctime aVar4;
  Aig_Man_t *pAVar5;
  Gia_Man_t *p;
  abctime aVar6;
  Vec_Ptr_t *vPios;
  Aig_Man_t *pAVar7;
  
  pvVar1 = pAig->pManTime;
  pAig->pManTime = (void *)0x0;
  pcVar2 = Abc_UtilStrsav(pAig->pName);
  pcVar3 = Abc_UtilStrsav(pAig->pSpec);
  aVar4 = Abc_Clock();
  pAVar5 = Aig_ManDupDfs(pAig);
  p = Dar_NewChoiceSynthesis(pAVar5,1,1,pPars->fPower,pPars->fLightSynth,pPars->fVerbose);
  aVar6 = Abc_Clock();
  pPars->timeSynth = aVar6 - aVar4;
  if (pPars->fUseGia == 0) {
    pAVar7 = Gia_ManToAigSkip(p,3);
    Gia_ManStop(p);
    pAVar5 = Dch_ComputeChoices(pAVar7,pPars);
    Aig_ManStop(pAVar7);
  }
  else {
    pAVar5 = Cec_ComputeChoices(p,pPars);
  }
  vPios = Aig_ManOrderPios(pAVar5,pAig);
  Aig_ManStop(pAig);
  pAVar7 = Aig_ManDupDfsGuided(pAVar5,vPios);
  Aig_ManStop(pAVar5);
  Vec_PtrFree(vPios);
  pAVar7->pManTime = pvVar1;
  Aig_ManChoiceLevel(pAVar7);
  if (pAVar7->pName != (char *)0x0) {
    free(pAVar7->pName);
    pAVar7->pName = (char *)0x0;
  }
  free(pAVar7->pSpec);
  pAVar7->pName = pcVar2;
  pAVar7->pSpec = pcVar3;
  return pAVar7;
}

Assistant:

Aig_Man_t * Dar_ManChoiceNew( Aig_Man_t * pAig, Dch_Pars_t * pPars )
{
    extern Aig_Man_t * Cec_ComputeChoices( Gia_Man_t * pGia, Dch_Pars_t * pPars );
//    extern Aig_Man_t * Dch_DeriveTotalAig( Vec_Ptr_t * vAigs );
    extern Aig_Man_t * Dch_ComputeChoices( Aig_Man_t * pAig, Dch_Pars_t * pPars );
//    int fVerbose = pPars->fVerbose;
    Aig_Man_t * pMan, * pTemp;
    Gia_Man_t * pGia;
    Vec_Ptr_t * vPios;
    void * pManTime;
    char * pName, * pSpec;
    abctime clk;

    // save useful things
    pManTime = pAig->pManTime; pAig->pManTime = NULL;
    pName = Abc_UtilStrsav( pAig->pName );
    pSpec = Abc_UtilStrsav( pAig->pSpec );

    // perform synthesis
clk = Abc_Clock();
    pGia = Dar_NewChoiceSynthesis( Aig_ManDupDfs(pAig), 1, 1, pPars->fPower, pPars->fLightSynth, pPars->fVerbose );
pPars->timeSynth = Abc_Clock() - clk;

    // perform choice computation
    if ( pPars->fUseGia )
        pMan = Cec_ComputeChoices( pGia, pPars );
    else
    {
        pMan = Gia_ManToAigSkip( pGia, 3 );
        Gia_ManStop( pGia );
        pMan = Dch_ComputeChoices( pTemp = pMan, pPars );
        Aig_ManStop( pTemp );
    }

    // create guidence
    vPios = Aig_ManOrderPios( pMan, pAig ); 
    Aig_ManStop( pAig );

    // reconstruct the network
    pMan = Aig_ManDupDfsGuided( pTemp = pMan, vPios );
    Aig_ManStop( pTemp );
    Vec_PtrFree( vPios );

    // reset levels
    pMan->pManTime = pManTime;
    Aig_ManChoiceLevel( pMan );

    // copy names
    ABC_FREE( pMan->pName );
    ABC_FREE( pMan->pSpec );
    pMan->pName = pName;
    pMan->pSpec = pSpec;
    return pMan;
}